

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

Symbol * sym_FindScopedValidSymbol(char *symName)

{
  Symbol *pSVar1;
  Section *pSVar2;
  MacroArgs *pMVar3;
  
  pSVar1 = sym_FindScopedSymbol(symName);
  if ((pSVar1 != PCSymbol) || (pSVar2 = sect_GetSymbolSection(), pSVar2 != (Section *)0x0)) {
    if (pSVar1 != _NARGSymbol) {
      return pSVar1;
    }
    pMVar3 = macro_GetCurrentArgs();
    if (pMVar3 != (MacroArgs *)0x0) {
      return pSVar1;
    }
  }
  return (Symbol *)0x0;
}

Assistant:

struct Symbol *sym_FindScopedValidSymbol(char const *symName)
{
	struct Symbol *sym = sym_FindScopedSymbol(symName);

	// `@` has no value outside a section
	if (sym == PCSymbol && !sect_GetSymbolSection()) {
		return NULL;
	}
	// `_NARG` has no value outside a macro
	if (sym == _NARGSymbol && !macro_GetCurrentArgs()) {
		return NULL;
	}
	return sym;
}